

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O0

void cab_convert_path_separator_2(cab *cab,archive_entry *entry)

{
  wchar_t *__s;
  size_t local_40;
  ulong local_28;
  size_t i;
  wchar_t *wp;
  archive_entry *entry_local;
  cab *cab_local;
  
  __s = archive_entry_pathname_w(entry);
  if (__s != (wchar_t *)0x0) {
    (cab->ws).length = 0;
    if (__s == (wchar_t *)0x0) {
      local_40 = 0;
    }
    else {
      local_40 = wcslen(__s);
    }
    archive_wstrncat(&cab->ws,__s,local_40);
    for (local_28 = 0; local_28 < (cab->ws).length; local_28 = local_28 + 1) {
      if ((cab->ws).s[local_28] == L'\\') {
        (cab->ws).s[local_28] = L'/';
      }
    }
    archive_entry_copy_pathname_w(entry,(cab->ws).s);
  }
  return;
}

Assistant:

static void
cab_convert_path_separator_2(struct cab *cab, struct archive_entry *entry)
{
	const wchar_t *wp;
	size_t i;

	/* If a conversion to wide character failed, force the replacement. */
	if ((wp = archive_entry_pathname_w(entry)) != NULL) {
		archive_wstrcpy(&(cab->ws), wp);
		for (i = 0; i < archive_strlen(&(cab->ws)); i++) {
			if (cab->ws.s[i] == L'\\')
				cab->ws.s[i] = L'/';
		}
		archive_entry_copy_pathname_w(entry, cab->ws.s);
	}
}